

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

void __thiscall sznet::net::Connector::stopInLoop(Connector *this)

{
  sz_sock sockfd;
  
  EventLoop::assertInLoopThread(this->m_loop);
  if (this->m_state == kConnecting) {
    this->m_state = kDisconnected;
    sockfd = removeAndResetChannel(this);
    retry(this,sockfd);
    return;
  }
  return;
}

Assistant:

void Connector::stopInLoop()
{
	m_loop->assertInLoopThread();
	if (m_state == kConnecting)
	{
		setState(kDisconnected);
		sockets::sz_sock sockfd = removeAndResetChannel();
		retry(sockfd);
	}
}